

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O2

void pokey_w(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  int iVar2;
  undefined4 uVar3;
  UINT8 *pUVar4;
  undefined1 uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  switch(offset & 0xf) {
  case 0:
    if (*(UINT8 *)((long)info + 0x8b) == data) {
      return;
    }
    *(UINT8 *)((long)info + 0x8b) = data;
    data = *(byte *)((long)info + 0x9b);
    bVar6 = ((data & 0x10) >> 4) * '\x02' + 1;
    bVar10 = true;
    goto LAB_0015d155;
  case 1:
    if (*(UINT8 *)((long)info + 0x8f) == data) {
      return;
    }
    *(UINT8 *)((long)info + 0x8f) = data;
    data = *(byte *)((long)info + 0x9b);
    bVar10 = true;
    bVar6 = 0;
    goto LAB_0015d2d4;
  case 2:
    if (*(UINT8 *)((long)info + 0x8c) == data) {
      return;
    }
    pUVar4 = (UINT8 *)((long)info + 0x8c);
    goto LAB_0015d203;
  case 3:
    if (*(UINT8 *)((long)info + 0x90) == data) {
      return;
    }
    pUVar4 = (UINT8 *)((long)info + 0x90);
LAB_0015d203:
    *pUVar4 = data;
    bVar6 = 0;
    bVar10 = true;
    goto LAB_0015d3c1;
  case 4:
    if (*(UINT8 *)((long)info + 0x8d) == data) {
      return;
    }
    *(UINT8 *)((long)info + 0x8d) = data;
    data = *(byte *)((long)info + 0x9b);
    bVar10 = (data & 8) == 0;
    bVar6 = 4;
LAB_0015d155:
    if ((bVar6 & 1) != 0) goto LAB_0015d2d4;
    goto LAB_0015d3b8;
  case 5:
    if (*(UINT8 *)((long)info + 0x91) == data) {
      return;
    }
    *(UINT8 *)((long)info + 0x91) = data;
    data = *(byte *)((long)info + 0x9b);
    bVar10 = true;
    goto LAB_0015d464;
  case 6:
    if (*(UINT8 *)((long)info + 0x8e) == data) {
      return;
    }
    pUVar4 = (UINT8 *)((long)info + 0x8e);
    goto LAB_0015d259;
  case 7:
    if (*(UINT8 *)((long)info + 0x92) == data) {
      return;
    }
    pUVar4 = (UINT8 *)((long)info + 0x92);
LAB_0015d259:
    *pUVar4 = data;
    goto LAB_0015d4ed;
  case 8:
    if (*(UINT8 *)((long)info + 0x9b) == data) {
      return;
    }
    uVar3 = 0x72;
    if ((data & 1) == 0) {
      uVar3 = 0x1c;
    }
    *(UINT8 *)((long)info + 0x9b) = data;
    *(undefined4 *)((long)info + 0x6c) = uVar3;
    bVar6 = 0xf;
    bVar10 = false;
LAB_0015d2d4:
    if ((data & 0x40) == 0) {
      uVar7 = (*(byte *)((long)info + 0x8b) + 1) * *(int *)((long)info + 0x6c);
    }
    else {
      uVar7 = *(byte *)((long)info + 0x8b) + 4;
    }
    bVar1 = *(byte *)((long)info + 0x8f);
    uVar8 = (bVar1 & 0xf) * 0x2e8;
    *(uint *)((long)info + 0x28) = uVar8;
    *(uint *)((long)info + 0x18) = uVar7;
    if ((int)uVar7 < *(int *)((long)info + 8)) {
      *(uint *)((long)info + 8) = uVar7;
    }
    if ((bVar1 & 0x10) == 0 && (bVar1 & 0xf) != 0) {
      if ((bVar1 & 0x20) == 0) {
        *(undefined1 *)((long)info + 0x3c) = 1;
      }
      else {
        bVar9 = uVar7 < *(uint *)((long)info + 0x44) >> 8;
        *(bool *)((long)info + 0x3c) = !bVar9;
        if (bVar9) goto LAB_0015d329;
      }
    }
    else {
      *(undefined1 *)((long)info + 0x3c) = 0;
LAB_0015d329:
      *(undefined1 *)((long)info + 0x38) = 1;
      *(undefined4 *)((long)info + 8) = 0x7fffffff;
      *(uint *)((long)info + 0x28) = uVar8 >> 1;
    }
LAB_0015d3b8:
    if ((bVar6 & 2) != 0) {
LAB_0015d3c1:
      data = *(byte *)((long)info + 0x9b);
      if ((data & 0x10) == 0) {
        uVar7 = (uint)*(byte *)((long)info + 0x8c);
LAB_0015d3e1:
        uVar7 = (uVar7 + 1) * *(int *)((long)info + 0x6c);
      }
      else {
        uVar7 = (uint)*(ushort *)((long)info + 0x8b);
        if ((data & 0x40) == 0) goto LAB_0015d3e1;
        uVar7 = uVar7 + 7;
      }
      bVar1 = *(byte *)((long)info + 0x90);
      uVar8 = (bVar1 & 0xf) * 0x2e8;
      *(uint *)((long)info + 0x2c) = uVar8;
      *(uint *)((long)info + 0x1c) = uVar7;
      if ((int)uVar7 < *(int *)((long)info + 0xc)) {
        *(uint *)((long)info + 0xc) = uVar7;
      }
      if ((bVar1 & 0x10) == 0 && (bVar1 & 0xf) != 0) {
        if ((bVar1 & 0x20) == 0) {
          *(undefined1 *)((long)info + 0x3d) = 1;
        }
        else {
          bVar9 = uVar7 < *(uint *)((long)info + 0x44) >> 8;
          *(bool *)((long)info + 0x3d) = !bVar9;
          if (bVar9) goto LAB_0015d42a;
        }
      }
      else {
        *(undefined1 *)((long)info + 0x3d) = 0;
LAB_0015d42a:
        *(undefined1 *)((long)info + 0x39) = 1;
        *(undefined4 *)((long)info + 0xc) = 0x7fffffff;
        *(uint *)((long)info + 0x2c) = uVar8 >> 1;
      }
    }
    if ((bVar6 & 4) != 0) {
LAB_0015d464:
      if ((data & 0x20) == 0) {
        uVar7 = (*(byte *)((long)info + 0x8d) + 1) * *(int *)((long)info + 0x6c);
      }
      else {
        uVar7 = *(byte *)((long)info + 0x8d) + 4;
      }
      bVar6 = *(byte *)((long)info + 0x91);
      uVar8 = (bVar6 & 0xf) * 0x2e8;
      *(uint *)((long)info + 0x30) = uVar8;
      *(uint *)((long)info + 0x20) = uVar7;
      if ((int)uVar7 < *(int *)((long)info + 0x10)) {
        *(uint *)((long)info + 0x10) = uVar7;
      }
      if (((bVar6 & 0xf) == 0 || (char)((bVar6 & 0x10) >> 4) != '\0') ||
         (((bVar6 & 0x20) != 0 && (uVar7 < *(uint *)((long)info + 0x44) >> 8)))) {
        bVar6 = data >> 2 & 1;
        *(byte *)((long)info + 0x3e) = bVar6;
        if (bVar6 == 0) {
          *(undefined1 *)((long)info + 0x3a) = 1;
          *(undefined4 *)((long)info + 0x10) = 0x7fffffff;
          *(uint *)((long)info + 0x30) = uVar8 >> 1;
        }
      }
      else {
        *(undefined1 *)((long)info + 0x3e) = 1;
      }
    }
    if (bVar10) {
      return;
    }
LAB_0015d4ed:
    bVar6 = *(byte *)((long)info + 0x9b);
    if ((bVar6 & 8) == 0) {
      uVar7 = (uint)*(byte *)((long)info + 0x8e);
LAB_0015d50c:
      uVar7 = (uVar7 + 1) * *(int *)((long)info + 0x6c);
    }
    else {
      uVar7 = (uint)*(ushort *)((long)info + 0x8d);
      if ((bVar6 & 0x20) == 0) goto LAB_0015d50c;
      uVar7 = uVar7 + 7;
    }
    bVar1 = *(byte *)((long)info + 0x92);
    uVar8 = (bVar1 & 0xf) * 0x2e8;
    *(uint *)((long)info + 0x34) = uVar8;
    *(uint *)((long)info + 0x24) = uVar7;
    if ((int)uVar7 < *(int *)((long)info + 0x14)) {
      *(uint *)((long)info + 0x14) = uVar7;
    }
    if (((bVar1 & 0xf) != 0 && (char)((bVar1 & 0x10) >> 4) == '\0') &&
       (((bVar1 & 0x20) == 0 || (*(uint *)((long)info + 0x44) >> 8 <= uVar7)))) {
      *(undefined1 *)((long)info + 0x3f) = 1;
      return;
    }
    bVar6 = bVar6 >> 1 & 1;
    *(byte *)((long)info + 0x3f) = bVar6;
    if (bVar6 == 0) {
      *(undefined1 *)((long)info + 0x3b) = 1;
      *(undefined4 *)((long)info + 0x14) = 0x7fffffff;
      *(uint *)((long)info + 0x34) = uVar8 >> 1;
    }
    break;
  case 9:
    *(undefined4 *)((long)info + 0x50) = 0;
    *(undefined8 *)((long)info + 8) = 0;
    *(undefined8 *)((long)info + 0x10) = 0;
    if ((*(byte *)((long)info + 0x9b) & 0x10) == 0) {
      if (4 < *(int *)((long)info + 0x18)) {
        *(double *)((long)info + 0x70) =
             (double)*(int *)((long)info + 0x18) * *(double *)((long)info + 0xa8);
        *(undefined1 *)((long)info + 0x88) = 1;
      }
      iVar2 = *(int *)((long)info + 0x1c);
      uVar5 = 2;
    }
    else {
      iVar2 = *(int *)((long)info + 0x1c);
      uVar5 = 3;
    }
    if (4 < iVar2) {
      *(double *)((long)info + 0x78) = (double)iVar2 * *(double *)((long)info + 0xa8);
      *(undefined1 *)((long)info + 0x89) = uVar5;
    }
    if ((((*(byte *)((long)info + 0x9b) & 8) == 0) || (0xf < *(byte *)((long)info + 0x92))) &&
       (4 < *(int *)((long)info + 0x24))) {
      *(double *)((long)info + 0x80) =
           (double)*(int *)((long)info + 0x24) * *(double *)((long)info + 0xa8);
      *(undefined1 *)((long)info + 0x8a) = 4;
      return;
    }
    break;
  case 10:
switchD_0015d102_caseD_a:
    *(byte *)((long)info + 0xa3) = *(byte *)((long)info + 0xa3) & 0x1f;
    return;
  case 0xe:
    if ((*(byte *)((long)info + 0xa1) & ~data) != 0) {
      *(byte *)((long)info + 0xa1) = *(byte *)((long)info + 0xa1) & data;
    }
    *(UINT8 *)((long)info + 0xa2) = data;
    return;
  case 0xf:
    if ((*(UINT8 *)((long)info + 0xa4) != data) &&
       (*(UINT8 *)((long)info + 0xa4) = data, (data & 3) == 0)) {
      if (*(char *)((long)info + 0xa1) != '\0') {
        *(undefined1 *)((long)info + 0xa1) = 0;
      }
      *(undefined1 *)((long)info + 0xa2) = 0;
      goto switchD_0015d102_caseD_a;
    }
  }
  return;
}

Assistant:

static void pokey_w(void *info, UINT8 offset, UINT8 data)
{
	pokey_state *p = (pokey_state *)info;
	int ch_mask = 0, new_val;

	/* determine which address was changed */
	switch (offset & 15)
	{
	case AUDF1_C:
		if( data == p->AUDF[CHAN1] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDF1  $%02x\n", p->device->tag(), data));
		p->AUDF[CHAN1] = data;
		ch_mask = 1 << CHAN1;
		if( p->AUDCTL & CH12_JOINED )		/* if ch 1&2 tied together */
			ch_mask |= 1 << CHAN2;    /* then also change on ch2 */
		break;

	case AUDC1_C:
		if( data == p->AUDC[CHAN1] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDC1  $%02x (%s)\n", p->device->tag(), data, audc2str(data)));
		p->AUDC[CHAN1] = data;
		ch_mask = 1 << CHAN1;
		break;

	case AUDF2_C:
		if( data == p->AUDF[CHAN2] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDF2  $%02x\n", p->device->tag(), data));
		p->AUDF[CHAN2] = data;
		ch_mask = 1 << CHAN2;
		break;

	case AUDC2_C:
		if( data == p->AUDC[CHAN2] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDC2  $%02x (%s)\n", p->device->tag(), data, audc2str(data)));
		p->AUDC[CHAN2] = data;
		ch_mask = 1 << CHAN2;
		break;

	case AUDF3_C:
		if( data == p->AUDF[CHAN3] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDF3  $%02x\n", p->device->tag(), data));
		p->AUDF[CHAN3] = data;
		ch_mask = 1 << CHAN3;

		if( p->AUDCTL & CH34_JOINED )	/* if ch 3&4 tied together */
			ch_mask |= 1 << CHAN4;  /* then also change on ch4 */
		break;

	case AUDC3_C:
		if( data == p->AUDC[CHAN3] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDC3  $%02x (%s)\n", p->device->tag(), data, audc2str(data)));
		p->AUDC[CHAN3] = data;
		ch_mask = 1 << CHAN3;
		break;

	case AUDF4_C:
		if( data == p->AUDF[CHAN4] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDF4  $%02x\n", p->device->tag(), data));
		p->AUDF[CHAN4] = data;
		ch_mask = 1 << CHAN4;
		break;

	case AUDC4_C:
		if( data == p->AUDC[CHAN4] )
			return;
		//LOG_SOUND(("POKEY '%s' AUDC4  $%02x (%s)\n", p->device->tag(), data, audc2str(data)));
		p->AUDC[CHAN4] = data;
		ch_mask = 1 << CHAN4;
		break;

	case AUDCTL_C:
		if( data == p->AUDCTL )
			return;
		//LOG_SOUND(("POKEY '%s' AUDCTL $%02x (%s)\n", p->device->tag(), data, audctl2str(data)));
		p->AUDCTL = data;
		ch_mask = 15;		/* all channels */
		/* determine the base multiplier for the 'div by n' calculations */
		p->clockmult = (p->AUDCTL & CLK_15KHZ) ? DIV_15 : DIV_64;
		break;

	case STIMER_C:
		/* first remove any existing timers */
		//LOG_TIMER(("POKEY '%s' STIMER $%02x\n", p->device->tag(), data));

		//p->timer[TIMER1]->adjust(attotime::never, p->timer_param[TIMER1]);
		//p->timer[TIMER2]->adjust(attotime::never, p->timer_param[TIMER2]);
		//p->timer[TIMER4]->adjust(attotime::never, p->timer_param[TIMER4]);

		/* reset all counters to zero (side effect) */
		p->polyadjust = 0;
		p->counter[CHAN1] = 0;
		p->counter[CHAN2] = 0;
		p->counter[CHAN3] = 0;
		p->counter[CHAN4] = 0;

		/* joined chan#1 and chan#2 ? */
		if( p->AUDCTL & CH12_JOINED )
		{
			if( p->divisor[CHAN2] > 4 )
			{
				//LOG_TIMER(("POKEY '%s' timer1+2 after %d clocks\n", p->device->tag(), p->divisor[CHAN2]));
				// set timer #1 _and_ #2 event after timer_div clocks of joined CHAN1+CHAN2 //
				p->timer_period[TIMER2] = p->clock_period * p->divisor[CHAN2];
				p->timer_param[TIMER2] = IRQ_TIMR2|IRQ_TIMR1;
			}
		}
		else
		{
			if( p->divisor[CHAN1] > 4 )
			{
				//LOG_TIMER(("POKEY '%s' timer1 after %d clocks\n", p->device->tag(), p->divisor[CHAN1]));
				// set timer #1 event after timer_div clocks of CHAN1 //
				p->timer_period[TIMER1] = p->clock_period * p->divisor[CHAN1];
				p->timer_param[TIMER1] = IRQ_TIMR1;
			}

			if( p->divisor[CHAN2] > 4 )
			{
				//LOG_TIMER(("POKEY '%s' timer2 after %d clocks\n", p->device->tag(), p->divisor[CHAN2]));
				// set timer #2 event after timer_div clocks of CHAN2 //
				p->timer_period[TIMER2] = p->clock_period * p->divisor[CHAN2];
				p->timer_param[TIMER2] = IRQ_TIMR2;
			}
		}

		// Note: p[chip] does not have a timer #3 //

		if( p->AUDCTL & CH34_JOINED )
		{
			// not sure about this: if audc4 == 0000xxxx don't start timer 4 ? //
			if( p->AUDC[CHAN4] & 0xf0 )
			{
				if( p->divisor[CHAN4] > 4 )
				{
					//LOG_TIMER(("POKEY '%s' timer4 after %d clocks\n", p->device->tag(), p->divisor[CHAN4]));
					// set timer #4 event after timer_div clocks of CHAN4 //
					p->timer_period[TIMER4] = p->clock_period * p->divisor[CHAN4];
					p->timer_param[TIMER4] = IRQ_TIMR4;
				}
			}
		}
		else
		{
			if( p->divisor[CHAN4] > 4 )
			{
				//LOG_TIMER(("POKEY '%s' timer4 after %d clocks\n", p->device->tag(), p->divisor[CHAN4]));
				// set timer #4 event after timer_div clocks of CHAN4 //
				p->timer_period[TIMER4] = p->clock_period * p->divisor[CHAN4];
				p->timer_param[TIMER4] = IRQ_TIMR4;
			}
		}

		//p->timer[TIMER1]->enable(p->IRQEN & IRQ_TIMR1);
		//p->timer[TIMER2]->enable(p->IRQEN & IRQ_TIMR2);
		//p->timer[TIMER4]->enable(p->IRQEN & IRQ_TIMR4);*/
		break;

	case SKREST_C:
		/* reset SKSTAT */
		//LOG(("POKEY '%s' SKREST $%02x\n", p->device->tag(), data));
		p->SKSTAT &= ~(SK_FRAME|SK_OVERRUN|SK_KBERR);
		break;

	case POTGO_C:
		//LOG(("POKEY '%s' POTGO  $%02x\n", p->device->tag(), data));
		//pokey_potgo(p);
		break;

	case SEROUT_C:
		//LOG(("POKEY '%s' SEROUT $%02x\n", p->device->tag(), data));
		break;

	case IRQEN_C:
		//LOG(("POKEY '%s' IRQEN  $%02x\n", p->device->tag(), data));

		/* acknowledge one or more IRQST bits ? */
		if( p->IRQST & ~data )
		{
			/* reset IRQST bits that are masked now */
			p->IRQST &= data;
		}
		else
		{
			/* enable/disable timers now to avoid unneeded
			   breaking of the CPU cores for masked timers */
			//if( p->timer[TIMER1] && ((p->IRQEN^data) & IRQ_TIMR1) )
			//	p->timer[TIMER1]->enable(data & IRQ_TIMR1);
			//if( p->timer[TIMER2] && ((p->IRQEN^data) & IRQ_TIMR2) )
			//	p->timer[TIMER2]->enable(data & IRQ_TIMR2);
			//if( p->timer[TIMER4] && ((p->IRQEN^data) & IRQ_TIMR4) )
			//	p->timer[TIMER4]->enable(data & IRQ_TIMR4);
		}
		/* store irq enable */
		p->IRQEN = data;
		break;

	case SKCTL_C:
		if( data == p->SKCTL )
			return;
		//LOG(("POKEY '%s' SKCTL  $%02x\n", p->device->tag(), data));
		p->SKCTL = data;
		if( !(data & SK_RESET) )
		{
			pokey_w(p, IRQEN_C,  0);
			pokey_w(p, SKREST_C, 0);
		}
		break;
	}

	/************************************************************
	 * As defined in the manual, the exact counter values are
	 * different depending on the frequency and resolution:
	 *    64 kHz or 15 kHz - AUDF + 1
	 *    1.79 MHz, 8-bit  - AUDF + 4
	 *    1.79 MHz, 16-bit - AUDF[CHAN1]+256*AUDF[CHAN2] + 7
	 ************************************************************/

	/* only reset the channels that have changed */

	if( ch_mask & (1 << CHAN1) )
	{
		/* process channel 1 frequency */
		if( p->AUDCTL & CH1_HICLK )
			new_val = p->AUDF[CHAN1] + DIVADD_HICLK;
		else
			new_val = (p->AUDF[CHAN1] + DIVADD_LOCLK) * p->clockmult;

		//LOG_SOUND(("POKEY '%s' chan1 %d\n", p->device->tag(), new_val));

		p->volume[CHAN1] = (p->AUDC[CHAN1] & VOLUME_MASK) * POKEY_DEFAULT_GAIN;
		p->divisor[CHAN1] = new_val;
		if( new_val < p->counter[CHAN1] )
			p->counter[CHAN1] = new_val;
		//if( p->interrupt_cb && p->timer[TIMER1] )
		//	p->timer[TIMER1]->adjust(p->clock_period * new_val, p->timer_param[TIMER1], p->timer_period[TIMER1]);
		p->audible[CHAN1] = !(
			(p->AUDC[CHAN1] & VOLUME_ONLY) ||
			(p->AUDC[CHAN1] & VOLUME_MASK) == 0 ||
			((p->AUDC[CHAN1] & PURE) && new_val < (p->samplerate_24_8 >> 8)));
		if( !p->audible[CHAN1] )
		{
			p->output[CHAN1] = 1;
			p->counter[CHAN1] = 0x7fffffff;
			/* 50% duty cycle should result in half volume */
			p->volume[CHAN1] >>= 1;
		}
	}

	if( ch_mask & (1 << CHAN2) )
	{
		/* process channel 2 frequency */
		if( p->AUDCTL & CH12_JOINED )
		{
			if( p->AUDCTL & CH1_HICLK )
				new_val = p->AUDF[CHAN2] * 256 + p->AUDF[CHAN1] + DIVADD_HICLK_JOINED;
			else
				new_val = (p->AUDF[CHAN2] * 256 + p->AUDF[CHAN1] + DIVADD_LOCLK) * p->clockmult;
			//LOG_SOUND(("POKEY '%s' chan1+2 %d\n", p->device->tag(), new_val));
		}
		else
		{
			new_val = (p->AUDF[CHAN2] + DIVADD_LOCLK) * p->clockmult;
			//LOG_SOUND(("POKEY '%s' chan2 %d\n", p->device->tag(), new_val));
		}

		p->volume[CHAN2] = (p->AUDC[CHAN2] & VOLUME_MASK) * POKEY_DEFAULT_GAIN;
		p->divisor[CHAN2] = new_val;
		if( new_val < p->counter[CHAN2] )
			p->counter[CHAN2] = new_val;
		//if( p->interrupt_cb && p->timer[TIMER2] )
		//	p->timer[TIMER2]->adjust(p->clock_period * new_val, p->timer_param[TIMER2], p->timer_period[TIMER2]);
		p->audible[CHAN2] = !(
			(p->AUDC[CHAN2] & VOLUME_ONLY) ||
			(p->AUDC[CHAN2] & VOLUME_MASK) == 0 ||
			((p->AUDC[CHAN2] & PURE) && new_val < (p->samplerate_24_8 >> 8)));
		if( !p->audible[CHAN2] )
		{
			p->output[CHAN2] = 1;
			p->counter[CHAN2] = 0x7fffffff;
			/* 50% duty cycle should result in half volume */
			p->volume[CHAN2] >>= 1;
		}
	}

	if( ch_mask & (1 << CHAN3) )
	{
		/* process channel 3 frequency */
		if( p->AUDCTL & CH3_HICLK )
			new_val = p->AUDF[CHAN3] + DIVADD_HICLK;
		else
			new_val = (p->AUDF[CHAN3] + DIVADD_LOCLK) * p->clockmult;

		//LOG_SOUND(("POKEY '%s' chan3 %d\n", p->device->tag(), new_val));

		p->volume[CHAN3] = (p->AUDC[CHAN3] & VOLUME_MASK) * POKEY_DEFAULT_GAIN;
		p->divisor[CHAN3] = new_val;
		if( new_val < p->counter[CHAN3] )
			p->counter[CHAN3] = new_val;
		/* channel 3 does not have a timer associated */
		p->audible[CHAN3] = !(
			(p->AUDC[CHAN3] & VOLUME_ONLY) ||
			(p->AUDC[CHAN3] & VOLUME_MASK) == 0 ||
			((p->AUDC[CHAN3] & PURE) && new_val < (p->samplerate_24_8 >> 8))) ||
			(p->AUDCTL & CH1_FILTER);
		if( !p->audible[CHAN3] )
		{
			p->output[CHAN3] = 1;
			p->counter[CHAN3] = 0x7fffffff;
			/* 50% duty cycle should result in half volume */
			p->volume[CHAN3] >>= 1;
		}
	}

	if( ch_mask & (1 << CHAN4) )
	{
		/* process channel 4 frequency */
		if( p->AUDCTL & CH34_JOINED )
		{
			if( p->AUDCTL & CH3_HICLK )
				new_val = p->AUDF[CHAN4] * 256 + p->AUDF[CHAN3] + DIVADD_HICLK_JOINED;
			else
				new_val = (p->AUDF[CHAN4] * 256 + p->AUDF[CHAN3] + DIVADD_LOCLK) * p->clockmult;
			//LOG_SOUND(("POKEY '%s' chan3+4 %d\n", p->device->tag(), new_val));
		}
		else
		{
			new_val = (p->AUDF[CHAN4] + DIVADD_LOCLK) * p->clockmult;
			//LOG_SOUND(("POKEY '%s' chan4 %d\n", p->device->tag(), new_val));
		}

		p->volume[CHAN4] = (p->AUDC[CHAN4] & VOLUME_MASK) * POKEY_DEFAULT_GAIN;
		p->divisor[CHAN4] = new_val;
		if( new_val < p->counter[CHAN4] )
			p->counter[CHAN4] = new_val;
		//if( p->interrupt_cb && p->timer[TIMER4] )
		//	p->timer[TIMER4]->adjust(p->clock_period * new_val, p->timer_param[TIMER4], p->timer_period[TIMER4]);
		p->audible[CHAN4] = !(
			(p->AUDC[CHAN4] & VOLUME_ONLY) ||
			(p->AUDC[CHAN4] & VOLUME_MASK) == 0 ||
			((p->AUDC[CHAN4] & PURE) && new_val < (p->samplerate_24_8 >> 8))) ||
			(p->AUDCTL & CH2_FILTER);
		if( !p->audible[CHAN4] )
		{
			p->output[CHAN4] = 1;
			p->counter[CHAN4] = 0x7fffffff;
			/* 50% duty cycle should result in half volume */
			p->volume[CHAN4] >>= 1;
		}
	}
}